

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSelect.c
# Opt level: O0

int Fxu_SelectSCD(Fxu_Matrix *p,int WeightLimit,Fxu_Var **ppVar1,Fxu_Var **ppVar2)

{
  Fxu_Var *pFVar1;
  int iVar2;
  Fxu_Cube *local_78;
  Fxu_Var *local_70;
  int local_64;
  int WeightBest;
  int WeightCur;
  int CounterTest;
  int CounterAll;
  int Coin;
  Fxu_Lit *pLitH;
  Fxu_Lit *pLitV;
  Fxu_Var *pVarTemp;
  Fxu_Var *pVar2;
  Fxu_Var *pVar1;
  Fxu_Var **ppVar2_local;
  Fxu_Var **ppVar1_local;
  int WeightLimit_local;
  Fxu_Matrix *p_local;
  
  local_64 = -10;
  pVar2 = (p->lVars).pHead;
  do {
    if (pVar2 == (Fxu_Var *)0x0) {
      return local_64;
    }
    p->ppTailVars = &p->pOrderVars;
    p->pOrderVars = (Fxu_Var *)0x0;
    for (pLitH = (pVar2->lLits).pHead; pLitH != (Fxu_Lit *)0x0; pLitH = pLitH->pVNext) {
      for (_CounterAll = pLitH->pHNext; _CounterAll != (Fxu_Lit *)0x0;
          _CounterAll = _CounterAll->pHNext) {
        pFVar1 = _CounterAll->pVar;
        if (pFVar1->pOrder == (Fxu_Var *)0x0) {
          *p->ppTailVars = pFVar1;
          p->ppTailVars = &pFVar1->pOrder;
          pFVar1->pOrder = (Fxu_Var *)0x1;
        }
      }
    }
    if (p->pOrderVars != (Fxu_Var *)0x0) {
      for (pVarTemp = p->pOrderVars; pVarTemp != (Fxu_Var *)0x1; pVarTemp = pVarTemp->pOrder) {
        iVar2 = Fxu_SingleCountCoincidence(p,pVar2,pVarTemp);
        if (iVar2 < 1) {
          __assert_fail("Coin > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuSelect.c"
                        ,0x241,"int Fxu_SelectSCD(Fxu_Matrix *, int, Fxu_Var **, Fxu_Var **)");
        }
        if (local_64 < iVar2 + -2) {
          *ppVar1 = pVar2;
          *ppVar2 = pVarTemp;
          local_64 = iVar2 + -2;
        }
      }
    }
    if (p->pOrderVars != (Fxu_Var *)0x0) {
      pVarTemp = p->pOrderVars;
      if (pVarTemp == (Fxu_Var *)0x1) {
        local_70 = (Fxu_Var *)0x1;
      }
      else {
        local_70 = pVarTemp->pOrder;
      }
      pLitV = (Fxu_Lit *)local_70;
      while (pVarTemp != (Fxu_Var *)0x1) {
        pVarTemp->pOrder = (Fxu_Var *)0x0;
        pVarTemp = (Fxu_Var *)pLitV;
        if (pLitV == (Fxu_Lit *)0x1) {
          local_78 = (Fxu_Cube *)0x1;
        }
        else {
          local_78 = pLitV[1].pCube;
        }
        pLitV = (Fxu_Lit *)local_78;
      }
    }
    p->pOrderVars = (Fxu_Var *)0x0;
    p->ppTailVars = (Fxu_Var **)0x0;
    pVar2 = pVar2->pNext;
  } while( true );
}

Assistant:

int Fxu_SelectSCD( Fxu_Matrix * p, int WeightLimit, Fxu_Var ** ppVar1, Fxu_Var ** ppVar2 )
{
//    int * pValue2Node = p->pValue2Node;
    Fxu_Var * pVar1;
    Fxu_Var * pVar2, * pVarTemp;
    Fxu_Lit * pLitV, * pLitH;
    int Coin;
    int CounterAll;
    int CounterTest;
    int WeightCur;
    int WeightBest;

    CounterAll = 0;
    CounterTest = 0;

    WeightBest = -10;
    
    // iterate through the columns in the matrix
    Fxu_MatrixForEachVariable( p, pVar1 )
    {
        // start collecting the affected vars
        Fxu_MatrixRingVarsStart( p );

        // go through all the literals of this variable
        for ( pLitV = pVar1->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        {
            // for this literal, go through all the horizontal literals
            for ( pLitH = pLitV->pHNext; pLitH; pLitH = pLitH->pHNext )
            {
                // get another variable
                pVar2 = pLitH->pVar;
                CounterAll++;
                // skip the var if it is already used
                if ( pVar2->pOrder )
                    continue;
                // skip the var if it belongs to the same node
//                if ( pValue2Node[pVar1->iVar] == pValue2Node[pVar2->iVar] )
//                    continue;
                // collect the var
                Fxu_MatrixRingVarsAdd( p, pVar2 );
            }
        }
        // stop collecting the selected vars
        Fxu_MatrixRingVarsStop( p );

        // iterate through the selected vars
        Fxu_MatrixForEachVarInRing( p, pVar2 )
        {
            CounterTest++;

            // count the coincidence
            Coin = Fxu_SingleCountCoincidence( p, pVar1, pVar2 );
            assert( Coin > 0 );

            // get the new weight
            WeightCur = Coin - 2;

            // compare the weights
            if ( WeightBest < WeightCur )
            {
                WeightBest = WeightCur;
                *ppVar1 = pVar1;
                *ppVar2 = pVar2;
            }
        }
        // unmark the vars
        Fxu_MatrixForEachVarInRingSafe( p, pVar2, pVarTemp )
            pVar2->pOrder = NULL;
        Fxu_MatrixRingVarsReset( p );
    }

//    if ( WeightBest == WeightLimit )
//        return -1;
    return WeightBest;
}